

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  size_t sVar3;
  size_t sVar4;
  string *psVar5;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  bool local_4a;
  byte local_49;
  size_t local_20;
  size_t len;
  size_t width;
  iterator *this_local;
  
  uVar1 = this->m_stringIndex;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->m_column->m_strings);
  if (sVar2 <= uVar1) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/catch/include/catch/catch.hpp"
                  ,0x214e,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar4 = this->m_column->m_width;
  sVar3 = indent(this);
  sVar4 = sVar4 - sVar3;
  this->m_end = this->m_pos;
  psVar5 = line_abi_cxx11_(this);
  pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)psVar5);
  if (*pcVar6 == '\n') {
    this->m_end = this->m_end + 1;
  }
  while( true ) {
    uVar1 = this->m_end;
    line_abi_cxx11_(this);
    uVar7 = ::std::__cxx11::string::size();
    bVar8 = false;
    if (uVar1 < uVar7) {
      psVar5 = line_abi_cxx11_(this);
      pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)psVar5);
      bVar8 = *pcVar6 != '\n';
    }
    if (!bVar8) break;
    this->m_end = this->m_end + 1;
  }
  local_20 = sVar4;
  if (this->m_end < this->m_pos + sVar4) {
    this->m_len = this->m_end - this->m_pos;
  }
  else {
    while( true ) {
      local_49 = 0;
      if (local_20 != 0) {
        bVar8 = isBoundary(this,this->m_pos + local_20);
        local_49 = bVar8 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      local_20 = local_20 - 1;
    }
    while( true ) {
      local_4a = false;
      if (local_20 != 0) {
        psVar5 = line_abi_cxx11_(this);
        pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)psVar5);
        local_4a = isWhitespace(*pcVar6);
      }
      if (local_4a == false) break;
      local_20 = local_20 - 1;
    }
    if (local_20 == 0) {
      this->m_suffix = true;
      this->m_len = sVar4 - 1;
    }
    else {
      this->m_len = local_20;
    }
  }
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}